

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_decode.c
# Opt level: O3

int cram_dependent_data_series(cram_fd *fd,cram_block_compression_hdr *hdr,cram_slice *s)

{
  byte *pbVar1;
  cram_block **ppcVar2;
  cram_block *pcVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined8 uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  void *__ptr;
  cram_block_slice_hdr *pcVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  cram_map *pcVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int bnum2;
  int local_50;
  uint local_4c;
  undefined8 local_48;
  undefined8 local_40;
  cram_fd *local_38;
  
  uVar20 = fd->required_fields;
  if ((uVar20 == 0) || (uVar20 == 0x7fffffff)) {
    hdr->data_series = 0x7fffffff;
    if (0 < s->hdr->num_blocks) {
      lVar27 = 0;
      do {
        iVar10 = cram_uncompress_block(s->block[lVar27]);
        if (iVar10 != 0) {
          return -1;
        }
        lVar27 = lVar27 + 1;
      } while (lVar27 < s->hdr->num_blocks);
    }
  }
  else {
    uVar17 = (uVar20 & 1) << 0xf;
    hdr->data_series = uVar17;
    uVar20 = fd->required_fields;
    auVar32._0_4_ = -(uint)((uVar20 & 0x40) == 0);
    auVar32._4_4_ = -(uint)((uVar20 & 0x20) == 0);
    auVar32._8_4_ = -(uint)((uVar20 & 8) == 0);
    auVar32._12_4_ = -(uint)((uVar20 & 4) == 0);
    auVar31._0_4_ = -(uint)((uVar20 & 0x3fe) == 0);
    auVar31._4_4_ = -(uint)((uVar20 & 0x200) == 0);
    auVar31._8_4_ = -(uint)((uVar20 & 0x100) == 0);
    auVar31._12_4_ = -(uint)((uVar20 & 0x80) == 0);
    auVar32 = packssdw(auVar31,auVar32);
    auVar32 = packsswb(auVar32,auVar32);
    uVar22 = 0x200001;
    if ((auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar22 = uVar20 >> 1 & 1;
    }
    uVar22 = uVar22 | uVar17;
    uVar17 = uVar22 | 3;
    if ((auVar32 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar17 = uVar22;
    }
    uVar17 = uVar17 | (uVar20 & 0x10) << 9;
    uVar22 = uVar17 | 0x3c00b1d;
    if ((auVar32 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar22 = uVar17;
    }
    uVar17 = uVar22 | 0x310021;
    if ((auVar32 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar17 = uVar22;
    }
    uVar22 = uVar17 | 0x120023;
    if ((auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar22 = uVar17;
    }
    uVar17 = uVar22 | 0x3fc0b3f;
    if ((auVar32 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      uVar17 = uVar22;
    }
    uVar22 = uVar17;
    if ((auVar32 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      uVar22 = uVar17 | 0x17c00fdf;
    }
    if ((auVar32 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      hdr->data_series = uVar22;
    }
    if ((uVar20 >> 0xb & 1) == 0) {
      fd->decode_md = 0;
    }
    if ((uVar20 & 0x1c00) != 0) {
      uVar17 = uVar17 | 0x17c00fdf;
      if ((uVar20 >> 10 & 1) == 0) {
        uVar17 = uVar22;
      }
      uVar22 = uVar17 | 0x40005000;
      if ((uVar20 >> 0xb & 1) == 0) {
        uVar22 = uVar17;
      }
      uVar17 = uVar22 | 0x1001;
      if ((uVar20 >> 0xc & 1) == 0) {
        uVar17 = uVar22;
      }
      hdr->data_series = uVar17;
    }
    iVar10 = cram_uncompress_block(*s->block);
    if (iVar10 != 0) {
      return -1;
    }
    __ptr = calloc((long)s->hdr->num_blocks + 1,4);
    if (__ptr == (void *)0x0) {
      return -1;
    }
    uVar20 = hdr->data_series;
    local_40 = 0;
    local_38 = fd;
    do {
      uVar17 = uVar20 | 0x104;
      uVar22 = uVar20;
      if ((uVar20 & 0x400000) != 0) {
        uVar22 = uVar17;
      }
      uVar6 = uVar22;
      if ((uVar22 & 0x800000) != 0) {
        uVar6 = uVar17;
      }
      local_48 = CONCAT44(local_48._4_4_,uVar6) & 0xffffffff01000000;
      if ((uVar6 & 0x1000000) != 0) {
        uVar6 = uVar17;
      }
      uVar11 = uVar6 | 0x104;
      uVar17 = uVar6;
      if ((uVar6 & 0x80) != 0) {
        uVar17 = uVar11;
      }
      uVar7 = uVar17;
      if ((uVar17 & 0x800) != 0) {
        uVar7 = uVar11;
      }
      uVar8 = uVar7;
      if ((uVar7 & 0x2000000) != 0) {
        uVar8 = uVar11;
      }
      uVar12 = uVar8 | 0x104;
      uVar11 = uVar8;
      if ((uVar8 & 0x400) != 0) {
        uVar11 = uVar12;
      }
      uVar24 = uVar11;
      if ((uVar11 & 0x10) != 0) {
        uVar24 = uVar12;
      }
      uVar4 = uVar24;
      if ((uVar24 & 0x40) != 0) {
        uVar4 = uVar12;
      }
      uVar12 = uVar4;
      if ((uVar4 & 0x4000000) != 0) {
        uVar12 = uVar4 | 0x104;
      }
      uVar25 = uVar12;
      if ((uVar12 & 0x10000000) != 0) {
        uVar25 = uVar4 | 0x104;
      }
      uVar5 = uVar25 | 8;
      if ((uVar25 & 0x17c00fdf) == 0) {
        uVar5 = uVar25;
      }
      uVar13 = (uVar5 & 4) << 6;
      uVar26 = uVar13 | uVar5 & 0x80100;
      uVar23 = (uVar5 & 0x400) << 0xb |
               (uVar5 & 0x2000) >> 0xd | ((uVar5 & 0x40000000) >> 0x10) + uVar26 * 2 |
               uVar13 | uVar5;
      uVar13 = uVar23 | 0x100000;
      if ((uVar23 & 0xf0020) == 0) {
        uVar13 = uVar23;
      }
      if ((uVar23 & 0xf0020) != 0 ||
          (((((((((((uVar11 & 0x10) != 0 || (uVar8 & 0x400) != 0) || (uVar24 & 0x40) != 0) ||
                 (uVar4 & 0x4000000) != 0) || (uVar12 & 0x10000000) != 0) ||
               (uVar25 & 0x17c00fdf) != 0) || (uVar5 & 4) != 0) || (uVar5 & 0x40000000) != 0) ||
            (uVar5 & 0x2000) != 0) || (uVar5 & 0x400) != 0) ||
          ((((uVar26 + (uVar22 & 0x800000) | uVar20 & 0x400000) + (int)local_48 != 0 ||
            (uVar6 & 0x80) != 0) || (uVar17 & 0x800) != 0) || (uVar7 & 0x2000000) != 0))) {
        hdr->data_series = uVar13;
      }
      bVar28 = hdr->read_names_included != 0;
      bVar30 = -1 < (short)uVar13;
      uVar20 = uVar13 | 0x100020;
      if (bVar30 || bVar28) {
        uVar20 = uVar13;
      }
      bVar29 = (uVar20 & 0x140000c0) == 0;
      local_4c = uVar20 | 0x100009;
      if (bVar29) {
        local_4c = uVar20;
      }
      if (!bVar29 || !bVar30 && !bVar28) {
        hdr->data_series = local_4c;
      }
      lVar27 = 0;
      do {
        if (((hdr->data_series >> ((uint)lVar27 & 0x1f) & 1) != 0) &&
           (hdr->codecs[cram_dependent_data_series::i_to_id[lVar27]] != (cram_codec *)0x0)) {
          iVar10 = cram_codec_to_id(hdr->codecs[cram_dependent_data_series::i_to_id[lVar27]],
                                    &local_50);
          do {
            if (iVar10 != -2) {
              if (iVar10 == -1) {
                local_40 = 1;
              }
              else {
                pcVar15 = s->hdr;
                if (0 < pcVar15->num_blocks) {
                  lVar18 = 0;
                  do {
                    pcVar3 = s->block[lVar18];
                    if ((pcVar3->content_type == EXTERNAL) && (pcVar3->content_id == iVar10)) {
                      *(undefined4 *)((long)__ptr + lVar18 * 4) = 1;
                      iVar14 = cram_uncompress_block(pcVar3);
                      if (iVar14 != 0) {
LAB_00145703:
                        free(__ptr);
                        return -1;
                      }
                      pcVar15 = s->hdr;
                    }
                    lVar18 = lVar18 + 1;
                  } while (lVar18 < pcVar15->num_blocks);
                }
              }
            }
          } while ((local_50 != -2) && (bVar28 = iVar10 != local_50, iVar10 = local_50, bVar28));
        }
        lVar27 = lVar27 + 1;
      } while (lVar27 != 0x1c);
      if (((local_38->required_fields & 0x800) != 0) || ((hdr->data_series & 0x40000000) != 0)) {
        uVar16 = 0;
        do {
          pcVar19 = hdr->tag_encoding_map[uVar16];
          local_48 = uVar16;
          while (pcVar19 != (cram_map *)0x0) {
            if (pcVar19->codec != (cram_codec *)0x0) {
              iVar10 = cram_codec_to_id(pcVar19->codec,&local_50);
              do {
                if (iVar10 != -2) {
                  if (iVar10 == -1) {
                    local_40 = 1;
                  }
                  else {
                    pcVar15 = s->hdr;
                    if (0 < pcVar15->num_blocks) {
                      lVar27 = 0;
                      do {
                        pcVar3 = s->block[lVar27];
                        if ((pcVar3->content_type == EXTERNAL) && (pcVar3->content_id == iVar10)) {
                          *(undefined4 *)((long)__ptr + lVar27 * 4) = 1;
                          iVar14 = cram_uncompress_block(pcVar3);
                          if (iVar14 != 0) goto LAB_00145703;
                          pcVar15 = s->hdr;
                        }
                        lVar27 = lVar27 + 1;
                      } while (lVar27 < pcVar15->num_blocks);
                    }
                  }
                }
              } while ((local_50 != -2) && (bVar28 = iVar10 != local_50, iVar10 = local_50, bVar28))
              ;
              pcVar19 = pcVar19->next;
            }
          }
          uVar16 = local_48 + 1;
        } while (uVar16 != 0x20);
      }
      uVar9 = local_40;
      lVar27 = 0;
      do {
        if (hdr->codecs[cram_dependent_data_series::i_to_id[lVar27]] != (cram_codec *)0x0) {
          iVar10 = cram_codec_to_id(hdr->codecs[cram_dependent_data_series::i_to_id[lVar27]],
                                    &local_50);
          uVar20 = 1 << ((byte)lVar27 & 0x1f);
          do {
            if (iVar10 != -2) {
              if (iVar10 == -1) {
                if ((int)uVar9 != 0) {
                  hdr->data_series = hdr->data_series | uVar20;
                }
              }
              else {
                lVar18 = (long)s->hdr->num_blocks;
                if (0 < lVar18) {
                  ppcVar2 = s->block;
                  lVar21 = 0;
                  do {
                    if (((ppcVar2[lVar21]->content_type == EXTERNAL) &&
                        (ppcVar2[lVar21]->content_id == iVar10)) &&
                       (*(int *)((long)__ptr + lVar21 * 4) != 0)) {
                      hdr->data_series = hdr->data_series | uVar20;
                    }
                    lVar21 = lVar21 + 1;
                  } while (lVar18 != lVar21);
                }
              }
            }
          } while ((local_50 != -2) && (bVar28 = iVar10 != local_50, iVar10 = local_50, bVar28));
        }
        lVar27 = lVar27 + 1;
      } while (lVar27 != 0x1c);
      lVar27 = 0;
      do {
        pcVar19 = hdr->tag_encoding_map[lVar27];
        while (pcVar19 != (cram_map *)0x0) {
          if (pcVar19->codec != (cram_codec *)0x0) {
            iVar10 = cram_codec_to_id(pcVar19->codec,&local_50);
            do {
              if (iVar10 != -2) {
                if (iVar10 == -1) {
                  pbVar1 = (byte *)((long)&hdr->data_series + 3);
                  *pbVar1 = *pbVar1 | 0x40;
                }
                else {
                  lVar18 = (long)s->hdr->num_blocks;
                  if (0 < lVar18) {
                    ppcVar2 = s->block;
                    lVar21 = 0;
                    do {
                      if (((ppcVar2[lVar21]->content_type != FILE_HEADER) &&
                          (ppcVar2[lVar21]->content_id == iVar10)) &&
                         (*(int *)((long)__ptr + lVar21 * 4) != 0)) {
                        pbVar1 = (byte *)((long)&hdr->data_series + 3);
                        *pbVar1 = *pbVar1 | 0x40;
                      }
                      lVar21 = lVar21 + 1;
                    } while (lVar18 != lVar21);
                  }
                }
              }
            } while ((local_50 != -2) && (bVar28 = iVar10 != local_50, iVar10 = local_50, bVar28));
            pcVar19 = pcVar19->next;
          }
        }
        lVar27 = lVar27 + 1;
      } while (lVar27 != 0x20);
      uVar20 = hdr->data_series;
    } while (local_4c != uVar20);
    free(__ptr);
  }
  return 0;
}

Assistant:

int cram_dependent_data_series(cram_fd *fd,
			       cram_block_compression_hdr *hdr,
			       cram_slice *s) {
    int *block_used;
    int core_used = 0;
    int i;
    static int i_to_id[] = {
	DS_BF, DS_AP, DS_FP, DS_RL, DS_DL, DS_NF, DS_BA, DS_QS,
	DS_FC, DS_FN, DS_BS, DS_IN, DS_RG, DS_MQ, DS_TL, DS_RN,
	DS_NS, DS_NP, DS_TS, DS_MF, DS_CF, DS_RI, DS_RS, DS_PD,
	DS_HC, DS_SC, DS_BB, DS_QQ,
    };
    uint32_t orig_ds;

    /*
     * Set the data_series bit field based on fd->required_fields
     * contents.
     */
    if (fd->required_fields && fd->required_fields != INT_MAX) {
	hdr->data_series = 0;

	if (fd->required_fields & SAM_QNAME)
	    hdr->data_series |= CRAM_RN;

	if (fd->required_fields & SAM_FLAG)
	    hdr->data_series |= CRAM_BF;

	if (fd->required_fields & SAM_RNAME)
	    hdr->data_series |= CRAM_RI | CRAM_BF;

	if (fd->required_fields & SAM_POS)
	    hdr->data_series |= CRAM_AP | CRAM_BF;

	if (fd->required_fields & SAM_MAPQ)
	    hdr->data_series |= CRAM_MQ;

	if (fd->required_fields & SAM_CIGAR)
	    hdr->data_series |= CRAM_CIGAR;

	if (fd->required_fields & SAM_RNEXT)
	    hdr->data_series |= CRAM_CF | CRAM_NF | CRAM_RI | CRAM_NS |CRAM_BF;

	if (fd->required_fields & SAM_PNEXT)
	    hdr->data_series |= CRAM_CF | CRAM_NF | CRAM_AP | CRAM_NP | CRAM_BF;

	if (fd->required_fields & SAM_TLEN)
	    hdr->data_series |= CRAM_CF | CRAM_NF | CRAM_AP | CRAM_TS |
		CRAM_BF | CRAM_MF | CRAM_RI | CRAM_CIGAR;

	if (fd->required_fields & SAM_SEQ)
	    hdr->data_series |= CRAM_SEQ;

	if (!(fd->required_fields & SAM_AUX))
	    // No easy way to get MD/NM without other tags at present
	    fd->decode_md = 0;

	if (fd->required_fields & SAM_QUAL)
	    hdr->data_series |= CRAM_SEQ;

	if (fd->required_fields & SAM_AUX)
	    hdr->data_series |= CRAM_RG | CRAM_TL | CRAM_aux;

	if (fd->required_fields & SAM_RGAUX)
	    hdr->data_series |= CRAM_RG | CRAM_BF;

	// Always uncompress CORE block
	if (cram_uncompress_block(s->block[0]))
	    return -1;
    } else {
	hdr->data_series = CRAM_ALL;

	for (i = 0; i < s->hdr->num_blocks; i++) {
	    if (cram_uncompress_block(s->block[i]))
		return -1;
	}

	return 0;
    }

    block_used = calloc(s->hdr->num_blocks+1, sizeof(int));
    if (!block_used)
	return -1;

    do {
	/*
	 * Also set data_series based on code prerequisites. Eg if we need
	 * CRAM_QS then we also need to know CRAM_RL so we know how long it
	 * is, or if we need FC/FP then we also need FN (number of features).
	 *
	 * It's not reciprocal though. We may be needing to decode FN
	 * but have no need to decode FC, FP and cigar ops.
	 */
	if (hdr->data_series & CRAM_RS)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_PD)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_HC)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_QS)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_IN)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_SC)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_BS)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_DL)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_BA)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_BB)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_QQ)    hdr->data_series |= CRAM_FC|CRAM_FP;

	// cram_decode_seq() needs seq[] array
	if (hdr->data_series & (CRAM_SEQ|CRAM_CIGAR)) hdr->data_series |= CRAM_RL;

	if (hdr->data_series & CRAM_FP)    hdr->data_series |= CRAM_FC;
	if (hdr->data_series & CRAM_FC)    hdr->data_series |= CRAM_FN;
	if (hdr->data_series & CRAM_aux)   hdr->data_series |= CRAM_TL;
	if (hdr->data_series & CRAM_MF)    hdr->data_series |= CRAM_CF;
	if (hdr->data_series & CRAM_MQ)    hdr->data_series |= CRAM_BF;
	if (hdr->data_series & CRAM_BS)    hdr->data_series |= CRAM_RI;
	if (hdr->data_series & (CRAM_MF |CRAM_NS |CRAM_NP |CRAM_TS |CRAM_NF))
	    hdr->data_series |= CRAM_CF;
	if (!hdr->read_names_included && hdr->data_series & CRAM_RN)
	    hdr->data_series |= CRAM_CF | CRAM_NF;
	if (hdr->data_series & (CRAM_BA | CRAM_QS | CRAM_BB | CRAM_QQ))
	    hdr->data_series |= CRAM_BF | CRAM_CF | CRAM_RL;

	orig_ds = hdr->data_series;

	// Find which blocks are in use.
	for (i = 0; i < sizeof(i_to_id)/sizeof(*i_to_id); i++) {
	    int bnum1, bnum2, j;
	    cram_codec *c = hdr->codecs[i_to_id[i]];

	    if (!(hdr->data_series & (1<<i)))
		continue;

	    if (!c)
		continue;

	    bnum1 = cram_codec_to_id(c, &bnum2);

	    for (;;) {
		switch (bnum1) {
		case -2:
		    break;

		case -1:
		    core_used = 1;
		    break;

		default:
		    for (j = 0; j < s->hdr->num_blocks; j++) {
			if (s->block[j]->content_type == EXTERNAL &&
			    s->block[j]->content_id == bnum1) {
			    block_used[j] = 1;
			    if (cram_uncompress_block(s->block[j])) {
				free(block_used);
				return -1;
			    }
			}
		    }
		    break;
		}

		if (bnum2 == -2 || bnum1 == bnum2)
		    break;

		bnum1 = bnum2; // 2nd pass
	    }
	}

	// Tags too
	if ((fd->required_fields & SAM_AUX) ||
	    (hdr->data_series & CRAM_aux)) {
	    for (i = 0; i < CRAM_MAP_HASH; i++) {
		int bnum1, bnum2, j;
		cram_map *m = hdr->tag_encoding_map[i];

		while (m) {
		    cram_codec *c = m->codec;
		    if (!c)
			continue;

		    bnum1 = cram_codec_to_id(c, &bnum2);

		    for (;;) {
			switch (bnum1) {
			case -2:
			    break;

			case -1:
			    core_used = 1;
			    break;

			default:
			    for (j = 0; j < s->hdr->num_blocks; j++) {
				if (s->block[j]->content_type == EXTERNAL &&
				    s->block[j]->content_id == bnum1) {
				    block_used[j] = 1;
				    if (cram_uncompress_block(s->block[j])) {
					free(block_used);
					return -1;
				    }
				}
			    }
			    break;
			}

			if (bnum2 == -2 || bnum1 == bnum2)
			    break;

			bnum1 = bnum2; // 2nd pass
		    }

		    m = m->next;
		}
	    }
	}

	// We now know which blocks are in used, so repeat and find
	// which other data series need to be added.
	for (i = 0; i < sizeof(i_to_id)/sizeof(*i_to_id); i++) {
	    int bnum1, bnum2, j;
	    cram_codec *c = hdr->codecs[i_to_id[i]];

	    if (!c)
		continue;

	    bnum1 = cram_codec_to_id(c, &bnum2);

	    for (;;) {
		switch (bnum1) {
		case -2:
		    break;

		case -1:
		    if (core_used) {
			//printf(" + data series %08x:\n", 1<<i);
			hdr->data_series |= 1<<i;
		    }
		    break;

		default:
		    for (j = 0; j < s->hdr->num_blocks; j++) {
			if (s->block[j]->content_type == EXTERNAL &&
			    s->block[j]->content_id == bnum1) {
			    if (block_used[j]) {
				//printf(" + data series %08x:\n", 1<<i);
				hdr->data_series |= 1<<i;
			    }
			}
		    }
		    break;
		}

		if (bnum2 == -2 || bnum1 == bnum2)
		    break;

		bnum1 = bnum2; // 2nd pass
	    }
	}

	// Tags too
	for (i = 0; i < CRAM_MAP_HASH; i++) {
	    int bnum1, bnum2, j;
	    cram_map *m = hdr->tag_encoding_map[i];

	    while (m) {
		cram_codec *c = m->codec;
		if (!c)
		    continue;

		bnum1 = cram_codec_to_id(c, &bnum2);
		
		for (;;) {
		    switch (bnum1) {
		    case -2:
			break;

		    case -1:
			//printf(" + data series %08x:\n", CRAM_aux);
			hdr->data_series |= CRAM_aux;
			break;

		    default:
			for (j = 0; j < s->hdr->num_blocks; j++) {
			    if (s->block[j]->content_type &&
				s->block[j]->content_id == bnum1) {
				if (block_used[j]) {
				    //printf(" + data series %08x:\n",
				    //       CRAM_aux);
				    hdr->data_series |= CRAM_aux;
				}
			    }
			}
			break;
		    }

		    if (bnum2 == -2 || bnum1 == bnum2)
			break;

		    bnum1 = bnum2; // 2nd pass
		}

		m = m->next;
	    }
	}
    } while (orig_ds != hdr->data_series);

    free(block_used);
    return 0;
}